

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bstrlib.c
# Opt level: O3

int bstrnicmp(const_bstring b0,const_bstring b1,int n)

{
  uint uVar1;
  uint uVar2;
  uchar *puVar3;
  uchar *puVar4;
  char cVar5;
  int iVar6;
  __int32_t **pp_Var7;
  ulong uVar8;
  uint uVar9;
  
  iVar6 = -0x8000;
  if ((((b0 != (const_bstring)0x0) && (puVar3 = b0->data, puVar3 != (uchar *)0x0)) &&
      (uVar1 = b0->slen, b1 != (const_bstring)0x0 && -1 < (int)uVar1)) &&
     ((puVar4 = b1->data, puVar4 != (uchar *)0x0 && (uVar2 = b1->slen, -1 < (int)(uVar2 | n))))) {
    uVar9 = n;
    if ((int)uVar1 < n) {
      uVar9 = uVar1;
    }
    if ((int)uVar2 <= (int)uVar9) {
      uVar9 = uVar2;
    }
    if (0 < (int)uVar9 && puVar3 != puVar4) {
      pp_Var7 = __ctype_tolower_loc();
      uVar8 = 0;
      do {
        if ((char)(*pp_Var7)[puVar4[uVar8]] != (char)(*pp_Var7)[puVar3[uVar8]]) {
          return (uint)puVar3[uVar8] - (uint)puVar4[uVar8];
        }
        uVar8 = uVar8 + 1;
      } while (uVar9 != uVar8);
    }
    iVar6 = 0;
    if (uVar1 != uVar2 && uVar9 != n) {
      pp_Var7 = __ctype_tolower_loc();
      if ((int)uVar9 < (int)uVar1) {
        cVar5 = (char)(*pp_Var7)[puVar3[(int)uVar9]];
        iVar6 = 0x100;
        if (cVar5 != '\0') {
          iVar6 = (int)cVar5;
        }
      }
      else {
        iVar6 = (*pp_Var7)[puVar4[(int)uVar9]] << 0x18;
        if (iVar6 == 0) {
          iVar6 = -0x100;
        }
        else {
          iVar6 = -(iVar6 >> 0x18);
        }
      }
    }
  }
  return iVar6;
}

Assistant:

int bstrnicmp (const_bstring b0, const_bstring b1, int n) {
int i, v, m;

	if (bdata (b0) == NULL || b0->slen < 0 ||
	    bdata (b1) == NULL || b1->slen < 0 || n < 0) return SHRT_MIN;
	m = n;
	if (m > b0->slen) m = b0->slen;
	if (m > b1->slen) m = b1->slen;

	if (b0->data != b1->data) {
		for (i = 0; i < m; i ++) {
			v  = (char) downcase (b0->data[i]);
			v -= (char) downcase (b1->data[i]);
			if (v != 0) return b0->data[i] - b1->data[i];
		}
	}

	if (n == m || b0->slen == b1->slen) return BSTR_OK;

	if (b0->slen > m) {
		v = (char) downcase (b0->data[m]);
		if (v) return v;
		return UCHAR_MAX + 1;
	}

	v = - (char) downcase (b1->data[m]);
	if (v) return v;
	return - (int) (UCHAR_MAX + 1);
}